

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O0

Wlc_Ntk_t * Wlc_NtkFromNdr(void *pData)

{
  Wlc_Ntk_t *pWVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  word *pwVar7;
  int *piVar8;
  Wlc_Obj_t *pWVar9;
  char *pcVar10;
  Abc_Nam_t *pAVar11;
  Vec_Wrd_t *pVVar12;
  word Entry;
  word Truth;
  int NameId_4;
  int iObj_3;
  char pName [20];
  int *pFanins;
  int NameId_3;
  int iObj_2;
  int nArray_1;
  int Signed_2;
  int Beg_2;
  int End_2;
  int t;
  int NameId_2;
  int iObj_1;
  Vec_Int_t *vTemp;
  Vec_Int_t F;
  int nArray;
  int Type;
  int Signed_1;
  int Beg_1;
  int End_1;
  int NameId_1;
  int iObj;
  int Signed;
  int Beg;
  int End;
  Wlc_Ntk_t *pNtk;
  Wlc_Ntk_t *pTemp;
  Vec_Wrd_t *vTruths;
  int NameIdMax;
  int NameId;
  int fFound;
  int nDigits;
  int *pArray;
  int Obj;
  int k;
  int i;
  int Mod;
  Vec_Int_t *vFanins;
  Vec_Int_t *vName2Obj;
  Wlc_Obj_t *pObj;
  Ndr_Data_t *p;
  void *pData_local;
  
  pObj = (Wlc_Obj_t *)pData;
  p = (Ndr_Data_t *)pData;
  _i = Vec_IntAlloc(100);
  k = 2;
  pTemp = (Wlc_Ntk_t *)0x0;
  iVar2 = Ndr_DataObjNum((Ndr_Data_t *)pObj,2);
  _Beg = Wlc_NtkAlloc("top",iVar2 + 1);
  Wlc_NtkCheckIntegrity(p);
  Vec_IntClear(&_Beg->vFfs);
  Wlc_NtkCleanNameId(_Beg);
  for (pArray._0_4_ = k + 1; iVar2 = (int)pArray, iVar3 = Ndr_DataEnd((Ndr_Data_t *)pObj,k),
      iVar2 < iVar3; pArray._0_4_ = iVar2 + (int)pArray) {
    iVar2 = Ndr_DataType((Ndr_Data_t *)pObj,(int)pArray);
    if ((iVar2 == 3) && (iVar2 = Ndr_ObjIsType((Ndr_Data_t *)pObj,(int)pArray,3), iVar2 != 0)) {
      NameId_1 = Ndr_ObjReadRange((Ndr_Data_t *)pObj,(int)pArray,&Signed,&iObj);
      End_1 = Wlc_ObjAlloc(_Beg,1,NameId_1,Signed,iObj);
      Beg_1 = Ndr_ObjReadBody((Ndr_Data_t *)pObj,(int)pArray,5);
      Wlc_ObjSetNameId(_Beg,End_1,Beg_1);
    }
    iVar2 = Ndr_DataSize((Ndr_Data_t *)pObj,(int)pArray);
  }
  pArray._0_4_ = k + 1;
  do {
    iVar2 = (int)pArray;
    iVar3 = Ndr_DataEnd((Ndr_Data_t *)pObj,k);
    if (iVar3 <= iVar2) {
      for (pArray._0_4_ = k + 1; iVar2 = (int)pArray, iVar3 = Ndr_DataEnd((Ndr_Data_t *)pObj,k),
          iVar2 < iVar3; pArray._0_4_ = iVar2 + (int)pArray) {
        iVar2 = Ndr_DataType((Ndr_Data_t *)pObj,(int)pArray);
        if ((iVar2 == 3) && (iVar2 = Ndr_ObjIsType((Ndr_Data_t *)pObj,(int)pArray,4), iVar2 != 0)) {
          iVar2 = Ndr_ObjReadRange((Ndr_Data_t *)pObj,(int)pArray,&Signed_2,&nArray_1);
          iVar3 = Ndr_ObjReadArray((Ndr_Data_t *)pObj,(int)pArray,4,(int **)&fFound);
          iVar2 = Wlc_ObjAlloc(_Beg,7,iVar2,Signed_2,nArray_1);
          iVar4 = Ndr_ObjReadBody((Ndr_Data_t *)pObj,(int)pArray,5);
          if ((iVar3 != 1) || (iVar4 != -1)) {
            __assert_fail("nArray == 1 && NameId == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                          ,0x1bf,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
          }
          vName2Obj = (Vec_Int_t *)Wlc_NtkObj(_Beg,iVar2);
          Vec_IntFill(_i,1,*_fFound);
          Wlc_ObjAddFanins(_Beg,(Wlc_Obj_t *)vName2Obj,_i);
          Wlc_ObjSetCo(_Beg,(Wlc_Obj_t *)vName2Obj,0);
        }
        iVar2 = Ndr_DataSize((Ndr_Data_t *)pObj,(int)pArray);
      }
      Vec_IntFree(_i);
      vFanins = Vec_IntInvert(&_Beg->vNameIds,0);
      for (Obj = 1; iVar2 = Obj, iVar3 = Wlc_NtkObjNumMax(_Beg), iVar2 < iVar3; Obj = Obj + 1) {
        vName2Obj = (Vec_Int_t *)Wlc_NtkObj(_Beg,Obj);
        register0x00000000 = Wlc_ObjFanins((Wlc_Obj_t *)vName2Obj);
        for (pArray._4_4_ = 0; iVar2 = pArray._4_4_, iVar3 = Wlc_ObjFaninNum((Wlc_Obj_t *)vName2Obj)
            , iVar2 < iVar3; pArray._4_4_ = pArray._4_4_ + 1) {
          iVar2 = Vec_IntEntry(vFanins,stack0xffffffffffffff20[pArray._4_4_]);
          stack0xffffffffffffff20[pArray._4_4_] = iVar2;
        }
      }
      if (_Beg->vInits != (Vec_Int_t *)0x0) {
        for (Obj = 0; iVar2 = Obj, iVar3 = Vec_IntSize(&_Beg->vFfs), iVar2 < iVar3; Obj = Obj + 1) {
          vTruths._4_4_ = Vec_IntEntry(&_Beg->vFfs,Obj);
          iVar2 = Obj;
          pVVar6 = &_Beg->vFfs;
          iVar3 = Vec_IntEntry(vFanins,vTruths._4_4_);
          Vec_IntWriteEntry(pVVar6,iVar2,iVar3);
        }
        for (Obj = 0; iVar2 = Obj, iVar3 = Vec_IntSize(_Beg->vInits), iVar2 < iVar3; Obj = Obj + 1)
        {
          vTruths._4_4_ = Vec_IntEntry(_Beg->vInits,Obj);
          iVar2 = Obj;
          if (0 < vTruths._4_4_) {
            pVVar6 = _Beg->vInits;
            iVar3 = Vec_IntEntry(vFanins,vTruths._4_4_);
            Vec_IntWriteEntry(pVVar6,iVar2,iVar3);
          }
        }
        uVar5 = Vec_IntSize(&_Beg->vFfs);
        if ((uVar5 & 1) != 0) {
          __assert_fail("(Vec_IntSize(&pNtk->vFfs) & 1) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                        ,0x1d6,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
        }
        iVar2 = Vec_IntSize(&_Beg->vFfs);
        iVar3 = Vec_IntSize(_Beg->vInits);
        if (iVar2 != iVar3 * 2) {
          __assert_fail("Vec_IntSize(&pNtk->vFfs) == 2 * Vec_IntSize(pNtk->vInits)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                        ,0x1d7,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
        }
        for (Obj = 0; iVar2 = Obj, iVar3 = Vec_IntSize(&_Beg->vFfs), iVar2 < iVar3; Obj = Obj + 1) {
          vName2Obj = (Vec_Int_t *)Wlc_NtkFf(_Beg,Obj);
          if ((Obj & 1U) != 0) {
            Wlc_ObjSetCo(_Beg,(Wlc_Obj_t *)vName2Obj,1);
          }
        }
        Vec_IntClear(&_Beg->vFfs);
        pcVar10 = Wlc_PrsConvertInitValues(_Beg);
        _Beg->pInits = pcVar10;
      }
      Vec_IntFree(vFanins);
      vTruths._0_4_ = Vec_IntFindMax(&_Beg->vNameIds);
      NameId = Abc_Base10Log((int)vTruths + 1);
      pAVar11 = Abc_NamStart((int)vTruths + 1,10);
      _Beg->pManName = pAVar11;
      Obj = 1;
      while( true ) {
        if ((int)vTruths < Obj) {
          pNtk = _Beg;
          _Beg = Wlc_NtkDupDfs(_Beg,0,1);
          Wlc_NtkFree(pNtk);
          if (pTemp != (Wlc_Ntk_t *)0x0) {
            iVar2 = Wlc_NtkObjNumMax(_Beg);
            pVVar12 = Vec_WrdStart(iVar2);
            _Beg->vLutTruths = pVVar12;
            for (Obj = 1; iVar2 = Obj, iVar3 = Wlc_NtkObjNumMax(_Beg), iVar2 < iVar3; Obj = Obj + 1)
            {
              vName2Obj = (Vec_Int_t *)Wlc_NtkObj(_Beg,Obj);
              iVar2 = Wlc_ObjId(_Beg,(Wlc_Obj_t *)vName2Obj);
              iVar3 = Wlc_ObjNameId(_Beg,iVar2);
              if (((vName2Obj->nCap & 0x3f) == 0x3b) && (iVar3 != 0)) {
                Entry = Vec_WrdEntry((Vec_Wrd_t *)pTemp,iVar3);
                Vec_WrdWriteEntry(_Beg->vLutTruths,iVar2,Entry);
              }
            }
            Vec_WrdFreeP((Vec_Wrd_t **)&pTemp);
          }
          _Beg->fMemPorts = 1;
          _Beg->fEasyFfs = 1;
          return _Beg;
        }
        sprintf((char *)&NameId_4,"s%0*d",(ulong)(uint)NameId,(ulong)(uint)Obj);
        vTruths._4_4_ = Abc_NamStrFindOrAdd(_Beg->pManName,(char *)&NameId_4,&NameIdMax);
        if ((NameIdMax != 0) || (Obj != vTruths._4_4_)) break;
        Obj = Obj + 1;
      }
      __assert_fail("!fFound && i == NameId",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                    ,0x1ec,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
    }
    iVar2 = Ndr_DataType((Ndr_Data_t *)pObj,(int)pArray);
    if (((iVar2 == 3) && (iVar2 = Ndr_ObjIsType((Ndr_Data_t *)pObj,(int)pArray,3), iVar2 == 0)) &&
       (iVar2 = Ndr_ObjIsType((Ndr_Data_t *)pObj,(int)pArray,4), iVar2 == 0)) {
      iVar2 = Ndr_ObjReadRange((Ndr_Data_t *)pObj,(int)pArray,&Signed_1,&Type);
      F.pArray._4_4_ = Ndr_ObjReadBody((Ndr_Data_t *)pObj,(int)pArray,6);
      vTemp._0_4_ = Ndr_ObjReadArray((Ndr_Data_t *)pObj,(int)pArray,4,(int **)&fFound);
      pWVar1 = _Beg;
      F._0_8_ = _fFound;
      _NameId_2 = (Vec_Int_t *)&vTemp;
      vTemp._4_4_ = (int)vTemp;
      F.pArray._0_4_ = (int)vTemp;
      iVar3 = Ndr_TypeNdr2Wlc(F.pArray._4_4_);
      t = Wlc_ObjAlloc(pWVar1,iVar3,iVar2,Signed_1,Type);
      End_2 = Ndr_ObjReadBody((Ndr_Data_t *)pObj,(int)pArray,5);
      Vec_IntClear(_i);
      Vec_IntAppend(_i,_NameId_2);
      if (F.pArray._4_4_ == 0x58) {
        if (_Beg->vInits == (Vec_Int_t *)0x0) {
          pVVar6 = Vec_IntAlloc(100);
          _Beg->vInits = pVVar6;
        }
        iVar2 = Vec_IntSize(_i);
        if (iVar2 == 2) {
          pVVar6 = _Beg->vInits;
          iVar2 = Vec_IntPop(_i);
          Vec_IntPush(pVVar6,iVar2);
        }
        else {
          Vec_IntPush(_Beg->vInits,-((Signed_1 - Type) + 1));
        }
        vName2Obj = (Vec_Int_t *)Wlc_NtkObj(_Beg,t);
        iVar2 = Wlc_ObjType((Wlc_Obj_t *)vName2Obj);
        if (iVar2 != 3) {
          __assert_fail("Wlc_ObjType(pObj) == WLC_OBJ_FO",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                        ,0x196,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
        }
        Wlc_ObjSetNameId(_Beg,t,End_2);
        Vec_IntPush(&_Beg->vFfs,End_2);
        iVar2 = Vec_IntSize(_i);
        if (iVar2 != 1) {
          __assert_fail("Vec_IntSize(vFanins) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                        ,0x19a,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
        }
        pVVar6 = &_Beg->vFfs;
        iVar2 = Vec_IntEntry(_i,0);
        Vec_IntPush(pVVar6,iVar2);
      }
      else {
        if (F.pArray._4_4_ == 0x59) {
          Vec_IntPush(&_Beg->vFfs2,t);
        }
        if (F.pArray._4_4_ == 0x4b) {
          if (pTemp == (Wlc_Ntk_t *)0x0) {
            pTemp = (Wlc_Ntk_t *)Vec_WrdStart(1000);
          }
          iVar2 = End_2;
          iVar3 = Vec_WrdSize((Vec_Wrd_t *)pTemp);
          if (iVar3 <= iVar2) {
            Vec_WrdFillExtra((Vec_Wrd_t *)pTemp,End_2 << 1,0);
          }
          pWVar1 = pTemp;
          iVar2 = End_2;
          pwVar7 = (word *)Ndr_ObjReadBodyP((Ndr_Data_t *)pObj,(int)pArray,9);
          Vec_WrdWriteEntry((Vec_Wrd_t *)pWVar1,iVar2,*pwVar7);
        }
        pVVar6 = _i;
        if (F.pArray._4_4_ == 0x5b) {
          Vec_IntPushTwo(_i,Signed_1,Type);
        }
        else if (F.pArray._4_4_ == 0x61) {
          piVar8 = Ndr_ObjReadBodyP((Ndr_Data_t *)pObj,(int)pArray,9);
          Ndr_ObjReadConstant(pVVar6,(char *)piVar8);
        }
        else if ((F.pArray._4_4_ == 0x15) && (iVar2 = Vec_IntSize(_i), iVar2 == 3)) {
          piVar8 = Vec_IntEntryP(_i,1);
          Beg_2 = *piVar8;
          piVar8 = Vec_IntEntryP(_i,2);
          iVar2 = *piVar8;
          piVar8 = Vec_IntEntryP(_i,1);
          iVar3 = Beg_2;
          *piVar8 = iVar2;
          piVar8 = Vec_IntEntryP(_i,2);
          *piVar8 = iVar3;
        }
        pWVar1 = _Beg;
        pWVar9 = Wlc_NtkObj(_Beg,t);
        Wlc_ObjAddFanins(pWVar1,pWVar9,_i);
        Wlc_ObjSetNameId(_Beg,t,End_2);
        if (F.pArray._4_4_ == 0x35) {
          vName2Obj = (Vec_Int_t *)Wlc_NtkObj(_Beg,t);
          iVar2 = Wlc_ObjFaninNum((Wlc_Obj_t *)vName2Obj);
          if (iVar2 != 2) {
            __assert_fail("Wlc_ObjFaninNum(pObj) == 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                          ,0x1b3,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
          }
          pWVar9 = Wlc_ObjFanin0(_Beg,(Wlc_Obj_t *)vName2Obj);
          *(ushort *)pWVar9 = *(ushort *)pWVar9 & 0xffbf | 0x40;
          pWVar9 = Wlc_ObjFanin1(_Beg,(Wlc_Obj_t *)vName2Obj);
          *(ushort *)pWVar9 = *(ushort *)pWVar9 & 0xffbf | 0x40;
        }
      }
    }
    iVar2 = Ndr_DataSize((Ndr_Data_t *)pObj,(int)pArray);
    pArray._0_4_ = iVar2 + (int)pArray;
  } while( true );
}

Assistant:

Wlc_Ntk_t * Wlc_NtkFromNdr( void * pData )
{
    Ndr_Data_t * p = (Ndr_Data_t *)pData;  
    Wlc_Obj_t * pObj; Vec_Int_t * vName2Obj, * vFanins = Vec_IntAlloc( 100 );
    int Mod = 2, i, k, Obj, * pArray, nDigits, fFound, NameId, NameIdMax;
    Vec_Wrd_t * vTruths = NULL;
    Wlc_Ntk_t * pTemp, * pNtk = Wlc_NtkAlloc( "top", Ndr_DataObjNum(p, Mod)+1 );
    Wlc_NtkCheckIntegrity( pData );
    Vec_IntClear( &pNtk->vFfs );
    //pNtk->pSpec = Abc_UtilStrsav( pFileName );
    // construct network and save name IDs
    Wlc_NtkCleanNameId( pNtk );
    Ndr_ModForEachPi( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjReadRange(p, Obj, &End, &Beg);
        int iObj = Wlc_ObjAlloc( pNtk, WLC_OBJ_PI, Signed, End, Beg );
        int NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        Wlc_ObjSetNameId( pNtk, iObj, NameId );
    }
    Ndr_ModForEachNode( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjReadRange(p, Obj, &End, &Beg);
        int Type    = Ndr_ObjReadBody( p, Obj, NDR_OPERTYPE );
        int nArray  = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        Vec_Int_t F = {nArray, nArray, pArray}, * vTemp = &F;
        int iObj    = Wlc_ObjAlloc( pNtk, Ndr_TypeNdr2Wlc(Type), Signed, End, Beg );
        int NameId  = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        Vec_IntClear( vFanins );
        Vec_IntAppend( vFanins, vTemp );
        if ( Type == ABC_OPER_DFF )
        {
            // save init state
            if ( pNtk->vInits == NULL )
                pNtk->vInits = Vec_IntAlloc( 100 );
            if ( Vec_IntSize(vFanins) == 2 )
                Vec_IntPush( pNtk->vInits, Vec_IntPop(vFanins) );
            else // assume const0 if init is not given
                Vec_IntPush( pNtk->vInits, -(End-Beg+1) );
            // save flop output
            pObj = Wlc_NtkObj(pNtk, iObj);
            assert( Wlc_ObjType(pObj) == WLC_OBJ_FO );
            Wlc_ObjSetNameId( pNtk, iObj, NameId );
            Vec_IntPush( &pNtk->vFfs, NameId );
            // save flop input
            assert( Vec_IntSize(vFanins) == 1 );
            Vec_IntPush( &pNtk->vFfs, Vec_IntEntry(vFanins, 0) );
            continue;
        }
        if ( Type == ABC_OPER_DFFRSE )
            Vec_IntPush( &pNtk->vFfs2, iObj );
        if ( Type == ABC_OPER_LUT )
        {
            if ( vTruths == NULL )
                vTruths = Vec_WrdStart( 1000 );
            if ( NameId >= Vec_WrdSize(vTruths) )
                Vec_WrdFillExtra( vTruths, 2*NameId, 0 );
            Vec_WrdWriteEntry( vTruths, NameId, *((word *)Ndr_ObjReadBodyP(p, Obj, NDR_FUNCTION)) );
        }
        if ( Type == ABC_OPER_SLICE )
            Vec_IntPushTwo( vFanins, End, Beg );
        else if ( Type == ABC_OPER_CONST )
            Ndr_ObjReadConstant( vFanins, (char *)Ndr_ObjReadBodyP(p, Obj, NDR_FUNCTION) );
        else if ( Type == ABC_OPER_BIT_MUX && Vec_IntSize(vFanins) == 3 )
            ABC_SWAP( int, Vec_IntEntryP(vFanins, 1)[0], Vec_IntEntryP(vFanins, 2)[0] );
        Wlc_ObjAddFanins( pNtk, Wlc_NtkObj(pNtk, iObj), vFanins );
        Wlc_ObjSetNameId( pNtk, iObj, NameId );
        if ( Type == ABC_OPER_ARI_SMUL )
        {
            pObj = Wlc_NtkObj(pNtk, iObj);
            assert( Wlc_ObjFaninNum(pObj) == 2 );
            Wlc_ObjFanin0(pNtk, pObj)->Signed = 1;
            Wlc_ObjFanin1(pNtk, pObj)->Signed = 1;
        }
    }
    // mark primary outputs
    Ndr_ModForEachPo( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjReadRange(p, Obj, &End, &Beg);
        int nArray  = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        int iObj    = Wlc_ObjAlloc( pNtk, WLC_OBJ_BUF, Signed, End, Beg );
        int NameId  = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        assert( nArray == 1 && NameId == -1 );
        pObj = Wlc_NtkObj( pNtk, iObj );
        Vec_IntFill( vFanins, 1, pArray[0] );
        Wlc_ObjAddFanins( pNtk, pObj, vFanins );
        Wlc_ObjSetCo( pNtk, pObj, 0 );
    }
    Vec_IntFree( vFanins );
    // map name IDs into object IDs
    vName2Obj = Vec_IntInvert( &pNtk->vNameIds, 0 );
    Wlc_NtkForEachObj( pNtk, pObj, i )
    {
        int * pFanins = Wlc_ObjFanins(pObj);
        for ( k = 0; k < Wlc_ObjFaninNum(pObj); k++ )
            pFanins[k] = Vec_IntEntry(vName2Obj, pFanins[k]);
    }
    if ( pNtk->vInits )
    {
        Vec_IntForEachEntry( &pNtk->vFfs, NameId, i )
            Vec_IntWriteEntry( &pNtk->vFfs, i, Vec_IntEntry(vName2Obj, NameId) );
        Vec_IntForEachEntry( pNtk->vInits, NameId, i )
            if ( NameId > 0 )
                Vec_IntWriteEntry( pNtk->vInits, i, Vec_IntEntry(vName2Obj, NameId) );
        // move FO/FI to be part of CI/CO
        assert( (Vec_IntSize(&pNtk->vFfs) & 1) == 0 );
        assert( Vec_IntSize(&pNtk->vFfs) == 2 * Vec_IntSize(pNtk->vInits) );
        Wlc_NtkForEachFf( pNtk, pObj, i )
            if ( i & 1 )
                Wlc_ObjSetCo( pNtk, pObj, 1 );
            //else
            //    Wlc_ObjSetCi( pNtk, pObj );
        Vec_IntClear( &pNtk->vFfs );
        // convert init values into binary string
        //Vec_IntPrint( &p->pNtk->vInits );
        pNtk->pInits = Wlc_PrsConvertInitValues( pNtk );
        //printf( "%s", p->pNtk->pInits );
    }
    Vec_IntFree(vName2Obj);
    // create fake object names
    NameIdMax = Vec_IntFindMax(&pNtk->vNameIds);
    nDigits = Abc_Base10Log( NameIdMax+1 );
    pNtk->pManName = Abc_NamStart( NameIdMax+1, 10 );
    for ( i = 1; i <= NameIdMax; i++ )
    {
        char pName[20]; sprintf( pName, "s%0*d", nDigits, i );
        NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pName, &fFound );
        assert( !fFound && i == NameId );
    }
    //Ndr_NtkPrintNodes( pNtk );
    //Wlc_WriteVer( pNtk, "temp_ndr.v", 0, 0 );
    // derive topological order
    pNtk = Wlc_NtkDupDfs( pTemp = pNtk, 0, 1 );
    Wlc_NtkFree( pTemp );
    // copy truth tables
    if ( vTruths )
    {
        pNtk->vLutTruths = Vec_WrdStart( Wlc_NtkObjNumMax(pNtk) );
        Wlc_NtkForEachObj( pNtk, pObj, i )
        {
            int iObj   = Wlc_ObjId(pNtk, pObj);
            int NameId = Wlc_ObjNameId(pNtk, iObj);
            word Truth;
            if ( pObj->Type != WLC_OBJ_LUT || NameId == 0 )
                continue;
            Truth = Vec_WrdEntry(vTruths, NameId);
            assert( sizeof(void *) == 8 || Wlc_ObjFaninNum(pObj) < 6 );
            Vec_WrdWriteEntry( pNtk->vLutTruths, iObj, Truth );
        }
        Vec_WrdFreeP( &vTruths );
    }
    //Ndr_NtkPrintNodes( pNtk );
    pNtk->fMemPorts = 1;          // the network contains memory ports
    pNtk->fEasyFfs = 1;           // the network contains simple flops
    return pNtk;
}